

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_int.c
# Opt level: O2

int mpt_data_convert_int8(int8_t *from,mpt_type_t type,void *dest)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  iovec *vec;
  char cVar4;
  
  if (from == (int8_t *)0x0) {
    cVar4 = '\0';
  }
  else {
    cVar4 = *from;
  }
  if (type == 0x6c) {
    cVar1 = mpt_type_int(8);
    type = (mpt_type_t)cVar1;
  }
  iVar2 = -3;
  switch(type) {
  case 0x62:
    goto switchD_0010eaab_caseD_62;
  case 99:
    ppuVar3 = __ctype_b_loc();
    if (-1 < (short)(*ppuVar3)[cVar4]) {
      return -2;
    }
    goto switchD_0010eaab_caseD_62;
  case 100:
    iVar2 = 8;
    if (dest != (void *)0x0) {
      *(double *)dest = (double)(int)cVar4;
    }
    break;
  case 0x65:
    iVar2 = 0x10;
    if (dest != (void *)0x0) {
      *(longdouble *)dest = (longdouble)(short)cVar4;
    }
    break;
  case 0x66:
    iVar2 = 4;
    if (dest != (void *)0x0) {
      *(float *)dest = (float)(int)cVar4;
    }
    break;
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x73:
  case 0x76:
  case 0x77:
    break;
  case 0x69:
    goto switchD_0010eaab_caseD_69;
  case 0x6e:
    goto switchD_0010eaab_caseD_6e;
  case 0x71:
    if (cVar4 < '\0') {
      return -2;
    }
switchD_0010eaab_caseD_6e:
    iVar2 = 2;
    if (dest != (void *)0x0) {
      *(short *)dest = (short)cVar4;
    }
    break;
  case 0x74:
    if (cVar4 < '\0') {
      return -2;
    }
  case 0x78:
    iVar2 = 8;
    if (dest != (void *)0x0) {
      *(long *)dest = (long)cVar4;
    }
    break;
  case 0x75:
    if (cVar4 < '\0') {
      return -2;
    }
switchD_0010eaab_caseD_69:
    iVar2 = 4;
    if (dest != (void *)0x0) {
      *(int *)dest = (int)cVar4;
    }
    break;
  case 0x79:
    if (cVar4 < '\0') {
      return -2;
    }
switchD_0010eaab_caseD_62:
    iVar2 = 1;
    if (dest != (void *)0x0) {
      *(char *)dest = cVar4;
    }
    break;
  default:
    if (type == 0x42) {
      if (dest == (void *)0x0) {
        iVar2 = -0x10;
      }
      else {
        *(int8_t **)dest = from;
        *(undefined8 *)((long)dest + 8) = 1;
        iVar2 = 0x10;
      }
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_data_convert_int8(const int8_t *from, MPT_TYPE(type) type, void *dest)
{
	int8_t val = 0;
	if (from) {
		val = *from;
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
		case 'c':
			if (!isgraph(val)) return MPT_ERROR(BadValue);
			if (dest) *((char *) dest) = val;
			return sizeof(char);
		case 'y':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'b':
			if (dest) *((int8_t *) dest) = val;
			return sizeof(int8_t);
		case 'q':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'n':
			if (dest) *((int16_t *) dest) = val;
			return sizeof(int16_t);
		case 'u':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'i':
			if (dest) *((int32_t *) dest) = val;
			return sizeof(int32_t);
		case 't':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'x':
			if (dest) *((int64_t *) dest) = val;
			return sizeof(int64_t);
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
	#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e':
			if (dest) *((long double *) dest) = val;
			return sizeof(long double);
	#endif
		case MPT_type_toVector('b'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
				return sizeof(*vec);
			}
			return MPT_ERROR(MissingData);
		default:
			/* invalid conversion */
			return MPT_ERROR(BadType);
	}
	return sizeof(*from);
}